

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Free_Games.cpp
# Opt level: O0

double __thiscall Free_Games::Free_GamesWin(Free_Games *this,double *credits,uint *bet)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_148;
  int local_12c;
  undefined1 local_128 [4];
  int i;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_110;
  undefined1 local_f8 [8];
  PaytableWisePharaohs5 paytableForGame;
  undefined1 local_c8 [7];
  bool isInFreeGames;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  undefined1 local_a8 [4];
  int currentGame;
  Bet betFreesSpin;
  Matrix mymatrix;
  undefined1 local_70 [8];
  Start startFreeSpin;
  string p;
  uint betInFreeGames;
  uint *bet_local;
  double *credits_local;
  Free_Games *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"You Won 50 Euros!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "They will be transfered in Credit Field After Free Games!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"3x Multiplier! on every line");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  p.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)&startFreeSpin._bet);
  Start::Start((Start *)local_70);
  Matrix::Matrix((Matrix *)&betFreesSpin._credit_bet);
  Bet::Bet((Bet *)local_a8);
  myVectorInStart.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c8);
  paytableForGame._39_1_ = 1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_110,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c8);
  PaytableWisePharaohs5::PaytableWisePharaohs5
            ((PaytableWisePharaohs5 *)local_f8,&local_110,*credits,*bet,
             (bool)(paytableForGame._39_1_ & 1));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_110);
  Matrix::getVectorMatrix
            ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_128,(Matrix *)&betFreesSpin._credit_bet);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_c8,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_128);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_128);
  for (local_12c = 0; local_12c < 0xf; local_12c = local_12c + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Current Game: ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,myVectorInStart.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar2 = std::operator<<(poVar2," of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xf);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'v\' to Start a Game!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,(string *)&startFreeSpin._bet);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&startFreeSpin._bet);
    if (*pcVar3 == 'v') {
      lVar4 = std::__cxx11::string::size();
      if (lVar4 == 1) {
        Start::takeCreditsWithBet((Start *)local_70,credits,(uint *)(p.field_2._M_local_buf + 0xc));
        Matrix::RandomNumbersInMatrix
                  (&local_148,(Matrix *)&betFreesSpin._credit_bet,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_c8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_148);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "---------------------------------------------");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<((ostream *)&std::cout," ");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Matrix::outPutMatrix
                  ((Matrix *)&betFreesSpin._credit_bet,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_c8);
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "---------------------------------------------");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        Start::checkForCreditsAndBet((Start *)local_70,credits,bet);
        Start::outputCreditsAndBetCurrentFreeGames((Start *)local_70,credits,bet);
        PaytableWisePharaohs5::PaytableWisePharaohs5Win
                  ((PaytableWisePharaohs5 *)local_f8,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_c8,credits,bet,(bool *)&paytableForGame.field_0x27);
        myVectorInStart.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             myVectorInStart.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c8);
  }
  dVar1 = *credits;
  PaytableWisePharaohs5::~PaytableWisePharaohs5((PaytableWisePharaohs5 *)local_f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c8);
  Bet::~Bet((Bet *)local_a8);
  Matrix::~Matrix((Matrix *)&betFreesSpin._credit_bet);
  Start::~Start((Start *)local_70);
  std::__cxx11::string::~string((string *)&startFreeSpin._bet);
  return dVar1;
}

Assistant:

double Free_Games::Free_GamesWin(double& credits, unsigned int  &bet) {
	//int currentBet = bet;
	//no bet in Free Spins
	//bet = 0;
	std::cout << "You Won 50 Euros!" << std::endl;
	std::cout << "They will be transfered in Credit Field After Free Games!" << std::endl;
	std::cout << "3x Multiplier! on every line" << std::endl;
	unsigned int betInFreeGames = 0;
	std::string p;
	Start startFreeSpin;
	Matrix mymatrix;
	Bet betFreesSpin;
	int currentGame = 1;
	std::vector<std::vector<int>>myVectorInStart;
	bool isInFreeGames = true;
	PaytableWisePharaohs5 paytableForGame(myVectorInStart, credits, bet, isInFreeGames);
	myVectorInStart = mymatrix.getVectorMatrix();
	//clears screen
	//if (system("CLS")) system("clear");
	for (int i = 0; i < FreeGamesSize; ++i) {
		std::cout << "Current Game: " << currentGame << " of " << FreeGamesSize << std::endl;
		std::cout << "Press 'v' to Start a Game!" << std::endl;
		std::cin >> p;
		if (p[0] == 'v' && p.size() == 1) {
			startFreeSpin.takeCreditsWithBet(credits, betInFreeGames);
			//need to change matrix with 6 figures! --- DONT!
			mymatrix.RandomNumbersInMatrix(myVectorInStart);
			
			std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			mymatrix.outPutMatrix(myVectorInStart);
			std::cout << "---------------------------------------------" << std::endl;
			startFreeSpin.checkForCreditsAndBet(credits, bet);
			startFreeSpin.outputCreditsAndBetCurrentFreeGames(credits, bet);
			paytableForGame.PaytableWisePharaohs5Win(myVectorInStart, credits, bet, isInFreeGames);
			currentGame++;
		}
		/*else {
			if (i != 0) {
				i--;
			}
		}*/
		myVectorInStart.clear();
	}
	
	return credits ;
}